

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tests.cpp
# Opt level: O2

void serialize_tests::Derived::
     SerializationOps<ParamsStream<DataStream&,serialize_tests::DerivedAndBaseFormat>,serialize_tests::Derived_const,ActionSerialize>
               (size_type obj,ParamsStream<DataStream_&,_serialize_tests::DerivedAndBaseFormat> *s)

{
  DerivedAndBaseFormat *pDVar1;
  long in_FS_OFFSET;
  string_view str;
  string_view str_00;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = s->m_params;
  local_40._M_dataplus._M_p = (pointer)pDVar1;
  local_40._M_string_length = obj;
  ParamsWrapper<serialize_tests::BaseFormat,serialize_tests::Base_const>::
  Serialize<ParamsStream<DataStream&,serialize_tests::DerivedAndBaseFormat>>
            ((ParamsWrapper<serialize_tests::BaseFormat,serialize_tests::Base_const> *)&local_40,s);
  if (pDVar1->m_derived_format == LOWER) {
    str_00._M_str = *(char **)(obj + 8);
    str_00._M_len = *(size_t *)(obj + 0x10);
    ToLower_abi_cxx11_(&local_40,str_00);
  }
  else {
    str._M_str = *(char **)(obj + 8);
    str._M_len = *(size_t *)(obj + 0x10);
    ToUpper_abi_cxx11_(&local_40,str);
  }
  Serialize<ParamsStream<DataStream&,serialize_tests::DerivedAndBaseFormat>,char>(s,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(Derived, obj)
    {
        auto& fmt = SER_PARAMS(DerivedAndBaseFormat);
        READWRITE(fmt.m_base_format(AsBase<Base>(obj)));

        if (ser_action.ForRead()) {
            std::string str;
            s >> str;
            SER_READ(obj, obj.m_derived_data = str);
        } else {
            s << (fmt.m_derived_format == DerivedAndBaseFormat::DerivedFormat::LOWER ?
                      ToLower(obj.m_derived_data) :
                      ToUpper(obj.m_derived_data));
        }
    }